

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_mem(char **strp,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  undefined1 auStack_68 [8];
  lyout out;
  
  if (strp == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_mem");
    iVar1 = 1;
  }
  else {
    out.type = LYOUT_FD;
    out._4_4_ = 0;
    out.buf_len = 0;
    out.buf_size = 0;
    out.method.mem.size = 0;
    out.buffered = (char *)0x0;
    out.method.f = (FILE *)0x0;
    out.method.mem.len = 0;
    auStack_68 = (undefined1  [8])0x2;
    iVar1 = lyd_print_((lyout *)auStack_68,root,format,options);
    *strp = (char *)out._0_8_;
    free((void *)out.method.mem.size);
  }
  return iVar1;
}

Assistant:

API int
lyd_print_mem(char **strp, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    struct lyout out;
    int r;

    if (!strp) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_MEMORY;

    r = lyd_print_(&out, root, format, options);

    *strp = out.method.mem.buf;
    free(out.buffered);
    return r;
}